

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::MemberSyntax*>::emplace_back<slang::syntax::MemberSyntax*>
          (SmallVectorBase<slang::syntax::MemberSyntax*> *this,MemberSyntax **args)

{
  iterator ppMVar1;
  MemberSyntax **args_local;
  SmallVectorBase<slang::syntax::MemberSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppMVar1 = SmallVectorBase<slang::syntax::MemberSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::MemberSyntax_*> *)
                 emplaceRealloc<slang::syntax::MemberSyntax*>(this,ppMVar1,args);
  }
  else {
    ppMVar1 = SmallVectorBase<slang::syntax::MemberSyntax_*>::end
                        ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
    *ppMVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::MemberSyntax_*> *)
                 SmallVectorBase<slang::syntax::MemberSyntax_*>::back
                           ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }